

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleInfoMap.h
# Opt level: O2

void __thiscall
cbtTriangleInfoMap::deSerialize(cbtTriangleInfoMap *this,cbtTriangleInfoMapData *tmapData)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  cbtTriangleInfoData *pcVar4;
  cbtTriangleInfo *pcVar5;
  cbtHashInt *pcVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  cbtTriangleInfo local_20;
  
  fVar7 = tmapData->m_planarEpsilon;
  fVar8 = tmapData->m_equalVertexThreshold;
  fVar9 = tmapData->m_edgeDistanceThreshold;
  this->m_convexEpsilon = tmapData->m_convexEpsilon;
  this->m_planarEpsilon = fVar7;
  this->m_equalVertexThreshold = fVar8;
  this->m_edgeDistanceThreshold = fVar9;
  this->m_zeroAreaThreshold = tmapData->m_zeroAreaThreshold;
  local_20.m_flags = 0;
  cbtAlignedObjectArray<int>::resize
            (&(this->super_cbtInternalTriangleInfoMap).m_hashTable,tmapData->m_hashTableSize,
             &local_20.m_flags);
  piVar2 = tmapData->m_hashTablePtr;
  piVar3 = (this->super_cbtInternalTriangleInfoMap).m_hashTable.m_data;
  for (lVar10 = 0; lVar10 < tmapData->m_hashTableSize; lVar10 = lVar10 + 1) {
    piVar3[lVar10] = piVar2[lVar10];
  }
  local_20.m_flags = 0;
  cbtAlignedObjectArray<int>::resize
            (&(this->super_cbtInternalTriangleInfoMap).m_next,tmapData->m_nextSize,&local_20.m_flags
            );
  piVar2 = tmapData->m_nextPtr;
  piVar3 = (this->super_cbtInternalTriangleInfoMap).m_next.m_data;
  for (lVar10 = 0; lVar10 < tmapData->m_nextSize; lVar10 = lVar10 + 1) {
    piVar3[lVar10] = piVar2[lVar10];
  }
  auVar12._8_4_ = 0x40c90fdb;
  auVar12._0_8_ = 0x40c90fdb40c90fdb;
  auVar12._12_4_ = 0x40c90fdb;
  local_20._4_8_ = vmovlps_avx(auVar12);
  local_20.m_edgeV2V0Angle = 6.2831855;
  local_20.m_flags = 0;
  cbtAlignedObjectArray<cbtTriangleInfo>::resize
            (&(this->super_cbtInternalTriangleInfoMap).m_valueArray,tmapData->m_numValues,&local_20)
  ;
  iVar1 = tmapData->m_numValues;
  pcVar4 = tmapData->m_valueArrayPtr;
  pcVar5 = (this->super_cbtInternalTriangleInfoMap).m_valueArray.m_data;
  lVar10 = 0;
  for (lVar11 = 0; lVar11 < iVar1; lVar11 = lVar11 + 1) {
    *(undefined8 *)((long)&pcVar5->m_edgeV0V1Angle + lVar10) =
         *(undefined8 *)((long)&pcVar4->m_edgeV0V1Angle + lVar10);
    *(undefined4 *)((long)&pcVar5->m_edgeV2V0Angle + lVar10) =
         *(undefined4 *)((long)&pcVar4->m_edgeV2V0Angle + lVar10);
    *(undefined4 *)((long)&pcVar5->m_flags + lVar10) =
         *(undefined4 *)((long)&pcVar4->m_flags + lVar10);
    lVar10 = lVar10 + 0x10;
  }
  local_20.m_flags = 0;
  cbtAlignedObjectArray<cbtHashInt>::resize
            (&(this->super_cbtInternalTriangleInfoMap).m_keyArray,tmapData->m_numKeys,
             (cbtHashInt *)&local_20);
  iVar1 = tmapData->m_numKeys;
  pcVar6 = (this->super_cbtInternalTriangleInfoMap).m_keyArray.m_data;
  piVar2 = tmapData->m_keyArrayPtr;
  for (lVar10 = 0; lVar10 < iVar1; lVar10 = lVar10 + 1) {
    pcVar6[lVar10].m_uid = piVar2[lVar10];
  }
  return;
}

Assistant:

SIMD_FORCE_INLINE void cbtTriangleInfoMap::deSerialize(cbtTriangleInfoMapData& tmapData)
{
	m_convexEpsilon = tmapData.m_convexEpsilon;
	m_planarEpsilon = tmapData.m_planarEpsilon;
	m_equalVertexThreshold = tmapData.m_equalVertexThreshold;
	m_edgeDistanceThreshold = tmapData.m_edgeDistanceThreshold;
	m_zeroAreaThreshold = tmapData.m_zeroAreaThreshold;
	m_hashTable.resize(tmapData.m_hashTableSize);
	int i = 0;
	for (i = 0; i < tmapData.m_hashTableSize; i++)
	{
		m_hashTable[i] = tmapData.m_hashTablePtr[i];
	}
	m_next.resize(tmapData.m_nextSize);
	for (i = 0; i < tmapData.m_nextSize; i++)
	{
		m_next[i] = tmapData.m_nextPtr[i];
	}
	m_valueArray.resize(tmapData.m_numValues);
	for (i = 0; i < tmapData.m_numValues; i++)
	{
		m_valueArray[i].m_edgeV0V1Angle = tmapData.m_valueArrayPtr[i].m_edgeV0V1Angle;
		m_valueArray[i].m_edgeV1V2Angle = tmapData.m_valueArrayPtr[i].m_edgeV1V2Angle;
		m_valueArray[i].m_edgeV2V0Angle = tmapData.m_valueArrayPtr[i].m_edgeV2V0Angle;
		m_valueArray[i].m_flags = tmapData.m_valueArrayPtr[i].m_flags;
	}

	m_keyArray.resize(tmapData.m_numKeys, cbtHashInt(0));
	for (i = 0; i < tmapData.m_numKeys; i++)
	{
		m_keyArray[i].setUid1(tmapData.m_keyArrayPtr[i]);
	}
}